

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_curse_conflict(parser *p)

{
  void *pvVar1;
  char *pcVar2;
  char *s2;
  curse *curse;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar2 = string_append(*(char **)((long)pvVar1 + 0x20),"|");
    *(char **)((long)pvVar1 + 0x20) = pcVar2;
    pcVar2 = *(char **)((long)pvVar1 + 0x20);
    s2 = parser_getstr(p,"conf");
    pcVar2 = string_append(pcVar2,s2);
    *(char **)((long)pvVar1 + 0x20) = pcVar2;
    pcVar2 = string_append(*(char **)((long)pvVar1 + 0x20),"|");
    *(char **)((long)pvVar1 + 0x20) = pcVar2;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_curse_conflict(struct parser *p) {
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	curse->conflict = string_append(curse->conflict, "|");
	curse->conflict = string_append(curse->conflict, parser_getstr(p, "conf"));
	curse->conflict = string_append(curse->conflict, "|");
	return PARSE_ERROR_NONE;
}